

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Pmx.cpp
# Opt level: O1

void __thiscall pmx::PmxModel::Read(PmxModel *this,istream *stream)

{
  undefined8 *puVar1;
  float fVar2;
  PmxVertex *__ptr;
  int *piVar3;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *__ptr_00;
  PmxMaterial *__ptr_01;
  PmxBone *__ptr_02;
  PmxMorph *__ptr_03;
  PmxFrame *__ptr_04;
  PmxRigidBody *__ptr_05;
  PmxJoint *__ptr_06;
  undefined1 auVar4 [16];
  undefined1 auVar5 [16];
  undefined1 auVar6 [16];
  undefined1 auVar7 [16];
  undefined1 auVar8 [16];
  undefined1 auVar9 [16];
  undefined8 uVar10;
  int iVar11;
  ulong uVar12;
  ulong uVar13;
  ulong *puVar14;
  int *__s;
  long *plVar15;
  long *plVar16;
  ulong *puVar17;
  ostream *poVar18;
  uint8_t in_CL;
  pointer __p;
  basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *pbVar19;
  long lVar20;
  char *pcVar21;
  ulong uVar22;
  long lVar23;
  char magic [4];
  pointer __p_7;
  undefined1 local_68 [32];
  anon_union_16_2_edb7204a_for_basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_11
  local_48;
  PmxJoint *local_38;
  
  std::istream::read((char *)stream,(long)&local_48 + 0xc);
  if ((((local_48._M_local_buf[0xc] == 'P') && (local_48._M_local_buf[0xd] == 'M')) &&
      (local_48._M_local_buf[0xe] == 'X')) && (local_48._M_local_buf[0xf] == ' ')) {
    std::istream::read((char *)stream,(long)this);
    fVar2 = this->version;
    if (((fVar2 == 2.0) && (!NAN(fVar2))) || ((fVar2 == 2.1 && (!NAN(fVar2))))) {
      local_48._M_allocated_capacity = (size_type)&this->setting;
      PmxSetting::Read((PmxSetting *)local_48._M_allocated_capacity,stream);
      ReadString_abi_cxx11_
                ((string *)local_68,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
      std::__cxx11::string::operator=((string *)&this->model_name,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      ReadString_abi_cxx11_
                ((string *)local_68,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
      std::__cxx11::string::operator=((string *)&this->model_english_name,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      ReadString_abi_cxx11_
                ((string *)local_68,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
      std::__cxx11::string::operator=((string *)&this->model_comment,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      ReadString_abi_cxx11_
                ((string *)local_68,(pmx *)stream,(istream *)(ulong)(this->setting).encoding,in_CL);
      std::__cxx11::string::operator=((string *)&this->model_english_comment,(string *)local_68);
      if ((undefined1 *)local_68._0_8_ != local_68 + 0x10) {
        operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
      }
      piVar3 = &this->vertex_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar22 = (ulong)this->vertex_count;
      auVar4._8_8_ = 0;
      auVar4._0_8_ = uVar22;
      uVar12 = SUB168(auVar4 * ZEXT816(0x78),0);
      uVar13 = uVar12 + 8;
      if (0xfffffffffffffff7 < uVar12) {
        uVar13 = 0xffffffffffffffff;
      }
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar4 * ZEXT816(0x78),8) == 0) {
        uVar12 = uVar13;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      *puVar14 = uVar22;
      if (uVar22 != 0) {
        lVar20 = 0;
        do {
          *(undefined8 *)((long)puVar14 + lVar20 + 0x70) = 0;
          *(undefined4 *)((long)puVar14 + lVar20 + 0x78) = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 8);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 0x18);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 0x28);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 0x38);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 0x48);
          *puVar1 = 0;
          puVar1[1] = 0;
          puVar1 = (undefined8 *)((long)puVar14 + lVar20 + 0x58);
          *puVar1 = 0;
          puVar1[1] = 0;
          lVar20 = lVar20 + 0x78;
        } while (uVar22 * 0x78 - lVar20 != 0);
      }
      local_68._0_8_ = (PmxVertex *)0x0;
      __ptr = (this->vertices)._M_t.
              super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
              super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
              super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl;
      (this->vertices)._M_t.
      super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>.
      super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl = (PmxVertex *)(puVar14 + 1);
      if (__ptr != (PmxVertex *)0x0) {
        std::default_delete<pmx::PmxVertex[]>::operator()
                  ((default_delete<pmx::PmxVertex[]> *)&this->vertices,__ptr);
      }
      if ((PmxVertex *)local_68._0_8_ != (PmxVertex *)0x0) {
        std::default_delete<pmx::PmxVertex[]>::operator()
                  ((default_delete<pmx::PmxVertex[]> *)local_68,(PmxVertex *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxVertex::Read((PmxVertex *)
                          ((long)((this->vertices)._M_t.
                                  super___uniq_ptr_impl<pmx::PmxVertex,_std::default_delete<pmx::PmxVertex[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pmx::PmxVertex_*,_std::default_delete<pmx::PmxVertex[]>_>
                                  .super__Head_base<0UL,_pmx::PmxVertex_*,_false>._M_head_impl)->
                                 positon + lVar20),stream,(PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x78;
        } while (lVar23 < *piVar3);
      }
      std::istream::read((char *)stream,(long)&this->index_count);
      uVar12 = 0xffffffffffffffff;
      if (-1 < (long)this->index_count) {
        uVar12 = (long)this->index_count * 4;
      }
      __s = (int *)operator_new__(uVar12);
      memset(__s,0,uVar12);
      piVar3 = (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
               super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
               super__Head_base<0UL,_int_*,_false>._M_head_impl;
      (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
      super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.super__Head_base<0UL,_int_*,_false>
      ._M_head_impl = __s;
      if (piVar3 != (int *)0x0) {
        operator_delete__(piVar3);
      }
      if (0 < this->index_count) {
        lVar20 = 0;
        do {
          iVar11 = ReadIndex(stream,(uint)(this->setting).vertex_index_size);
          (this->indices)._M_t.super___uniq_ptr_impl<int,_std::default_delete<int[]>_>._M_t.
          super__Tuple_impl<0UL,_int_*,_std::default_delete<int[]>_>.
          super__Head_base<0UL,_int_*,_false>._M_head_impl[lVar20] = iVar11;
          lVar20 = lVar20 + 1;
        } while (lVar20 < this->index_count);
      }
      piVar3 = &this->texture_count;
      std::istream::read((char *)stream,(long)piVar3);
      lVar23 = (long)this->texture_count;
      lVar20 = lVar23 * 0x20;
      uVar12 = 0xffffffffffffffff;
      if (-1 < lVar23) {
        uVar12 = lVar20 + 8;
      }
      plVar15 = (long *)operator_new__(uVar12);
      pbVar19 = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(plVar15 + 1);
      *plVar15 = lVar23;
      if (lVar23 != 0) {
        plVar15 = plVar15 + 3;
        do {
          plVar15[-2] = (long)plVar15;
          plVar15[-1] = 0;
          *(undefined1 *)plVar15 = 0;
          plVar15 = plVar15 + 4;
          lVar20 = lVar20 + -0x20;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0;
      __ptr_00 = (this->textures)._M_t.
                 super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                 .
                 super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                 ._M_head_impl;
      (this->textures)._M_t.
      super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
      ._M_t.
      super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
      .
      super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
      ._M_head_impl = pbVar19;
      if (__ptr_00 != (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::default_delete<std::__cxx11::string[]>::operator()
                  ((default_delete<std::__cxx11::string[]> *)&this->textures,__ptr_00);
      }
      if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
          (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)0x0) {
        std::default_delete<std::__cxx11::string[]>::operator()
                  ((default_delete<std::__cxx11::string[]> *)local_68,
                   (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)
                   local_68._0_8_);
      }
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          ReadString_abi_cxx11_
                    ((string *)local_68,(pmx *)stream,
                     (istream *)(ulong)*(byte *)local_48._M_allocated_capacity,(uint8_t)pbVar19);
          std::__cxx11::string::operator=
                    ((string *)
                     ((long)&((this->textures)._M_t.
                              super___uniq_ptr_impl<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                              ._M_t.
                              super__Tuple_impl<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_std::default_delete<std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>[]>_>
                              .
                              super__Head_base<0UL,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>_*,_false>
                             ._M_head_impl)->_M_dataplus + lVar20),(string *)local_68);
          if ((basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)local_68._0_8_ !=
              (basic_string<char,_std::char_traits<char>,_std::allocator<char>_> *)(local_68 + 0x10)
             ) {
            operator_delete((void *)local_68._0_8_,local_68._16_8_ + 1);
          }
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x20;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->material_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar13 = (ulong)this->material_count;
      auVar5._8_8_ = 0;
      auVar5._0_8_ = uVar13;
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar5 * ZEXT816(0xc0),8) == 0) {
        uVar12 = SUB168(auVar5 * ZEXT816(0xc0),0) | 8;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      *puVar14 = uVar13;
      if (uVar13 != 0) {
        lVar20 = uVar13 * 0xc0;
        puVar17 = puVar14 + 0x16;
        do {
          puVar17[-0x15] = (ulong)(puVar17 + -0x13);
          puVar17[-0x14] = 0;
          *(undefined1 *)(puVar17 + -0x13) = 0;
          puVar17[-0x11] = (ulong)(puVar17 + -0xf);
          puVar17[-0x10] = 0;
          *(undefined1 *)(puVar17 + -0xf) = 0;
          *(undefined4 *)((long)puVar17 + -0x4c) = 0;
          *(undefined1 *)((long)puVar17 + -0x3c) = 0;
          *(undefined4 *)(puVar17 + -3) = 0;
          puVar17[-5] = 0;
          *(undefined8 *)((long)puVar17 + -0x22) = 0;
          puVar17[-2] = (ulong)puVar17;
          puVar17[-1] = 0;
          *(undefined1 *)puVar17 = 0;
          *(undefined4 *)(puVar17 + 2) = 0;
          *(undefined4 *)(puVar17 + -8) = 0;
          puVar17[-9] = 0;
          *(undefined4 *)(puVar17 + -6) = 0;
          puVar17[-7] = 0;
          *(undefined8 *)((long)puVar17 + -0x5c) = 0;
          *(undefined8 *)((long)puVar17 + -0x54) = 0;
          puVar17[-0xd] = 0;
          puVar17[-0xc] = 0;
          puVar17 = puVar17 + 0x18;
          lVar20 = lVar20 + -0xc0;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxMaterial *)0x0;
      __ptr_01 = (this->materials)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>.
                 _M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                 .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl;
      (this->materials)._M_t.
      super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>.
      super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl = (PmxMaterial *)(puVar14 + 1);
      if (__ptr_01 != (PmxMaterial *)0x0) {
        std::default_delete<pmx::PmxMaterial[]>::operator()
                  ((default_delete<pmx::PmxMaterial[]> *)&this->materials,__ptr_01);
      }
      if ((PmxMaterial *)local_68._0_8_ != (PmxMaterial *)0x0) {
        std::default_delete<pmx::PmxMaterial[]>::operator()
                  ((default_delete<pmx::PmxMaterial[]> *)local_68,(PmxMaterial *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxMaterial::Read((PmxMaterial *)
                            ((long)((this->materials)._M_t.
                                    super___uniq_ptr_impl<pmx::PmxMaterial,_std::default_delete<pmx::PmxMaterial[]>_>
                                    ._M_t.
                                    super__Tuple_impl<0UL,_pmx::PmxMaterial_*,_std::default_delete<pmx::PmxMaterial[]>_>
                                    .super__Head_base<0UL,_pmx::PmxMaterial_*,_false>._M_head_impl)
                                   ->diffuse + lVar20 + 0xffffffffffffffc0U),stream,
                            (PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0xc0;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->bone_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar13 = (ulong)this->bone_count;
      auVar6._8_8_ = 0;
      auVar6._0_8_ = uVar13;
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar6 * ZEXT816(0xb0),8) == 0) {
        uVar12 = SUB168(auVar6 * ZEXT816(0xb0),0) | 8;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      *puVar14 = uVar13;
      if (uVar13 != 0) {
        lVar20 = uVar13 * 0xb0;
        puVar17 = puVar14 + 7;
        do {
          puVar17[-6] = (ulong)(puVar17 + -4);
          puVar17[-5] = 0;
          *(undefined1 *)(puVar17 + -4) = 0;
          puVar17[-2] = (ulong)puVar17;
          puVar17[-1] = 0;
          *(undefined1 *)puVar17 = 0;
          puVar17[2] = 0;
          puVar17[3] = 0;
          *(undefined8 *)((long)puVar17 + 0x1e) = 0;
          puVar17[5] = 0;
          puVar17[6] = 0;
          puVar17[7] = 0;
          puVar17[8] = 0;
          puVar17[9] = 0;
          puVar17[10] = 0;
          puVar17[0xb] = 0;
          puVar17[0xc] = 0;
          puVar17[0xd] = 0;
          puVar17[0xe] = 0;
          puVar17[0xf] = 0;
          puVar17 = puVar17 + 0x16;
          lVar20 = lVar20 + -0xb0;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxBone *)0x0;
      __ptr_02 = (this->bones)._M_t.
                 super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
                 super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl;
      (this->bones)._M_t.super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>.
      _M_t.super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>.
      super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl = (PmxBone *)(puVar14 + 1);
      if (__ptr_02 != (PmxBone *)0x0) {
        std::default_delete<pmx::PmxBone[]>::operator()
                  ((default_delete<pmx::PmxBone[]> *)&this->bones,__ptr_02);
      }
      if ((PmxBone *)local_68._0_8_ != (PmxBone *)0x0) {
        std::default_delete<pmx::PmxBone[]>::operator()
                  ((default_delete<pmx::PmxBone[]> *)local_68,(PmxBone *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxBone::Read((PmxBone *)
                        ((long)((this->bones)._M_t.
                                super___uniq_ptr_impl<pmx::PmxBone,_std::default_delete<pmx::PmxBone[]>_>
                                ._M_t.
                                super__Tuple_impl<0UL,_pmx::PmxBone_*,_std::default_delete<pmx::PmxBone[]>_>
                                .super__Head_base<0UL,_pmx::PmxBone_*,_false>._M_head_impl)->
                               position + lVar20 + 0xffffffffffffffc0U),stream,(PmxSetting *)uVar10)
          ;
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0xb0;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->morph_count;
      std::istream::read((char *)stream,(long)piVar3);
      lVar23 = (long)this->morph_count;
      lVar20 = lVar23 * 0x80;
      uVar12 = 0xffffffffffffffff;
      if (-1 < lVar23) {
        uVar12 = lVar20 + 8;
      }
      plVar15 = (long *)operator_new__(uVar12);
      *plVar15 = lVar23;
      if (lVar23 != 0) {
        plVar16 = plVar15 + 7;
        do {
          plVar16[-6] = (long)(plVar16 + -4);
          plVar16[-5] = 0;
          *(undefined1 *)(plVar16 + -4) = 0;
          plVar16[-2] = (long)plVar16;
          plVar16[-1] = 0;
          *(undefined1 *)plVar16 = 0;
          *(undefined8 *)((long)plVar16 + 0x14) = 0;
          *(undefined8 *)((long)plVar16 + 0x1c) = 0;
          *(undefined8 *)((long)plVar16 + 0x24) = 0;
          *(undefined8 *)((long)plVar16 + 0x2c) = 0;
          *(undefined8 *)((long)plVar16 + 0x34) = 0;
          *(undefined8 *)((long)plVar16 + 0x3c) = 0;
          plVar16[8] = 0;
          plVar16[9] = 0;
          plVar16 = plVar16 + 0x10;
          lVar20 = lVar20 + -0x80;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxMorph *)0x0;
      __ptr_03 = (this->morphs)._M_t.
                 super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
                 super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl;
      (this->morphs)._M_t.
      super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>.
      super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl = (PmxMorph *)(plVar15 + 1);
      if (__ptr_03 != (PmxMorph *)0x0) {
        std::default_delete<pmx::PmxMorph[]>::operator()
                  ((default_delete<pmx::PmxMorph[]> *)&this->morphs,__ptr_03);
      }
      if ((PmxMorph *)local_68._0_8_ != (PmxMorph *)0x0) {
        std::default_delete<pmx::PmxMorph[]>::operator()
                  ((default_delete<pmx::PmxMorph[]> *)local_68,(PmxMorph *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxMorph::Read((PmxMorph *)
                         ((long)&((this->morphs)._M_t.
                                  super___uniq_ptr_impl<pmx::PmxMorph,_std::default_delete<pmx::PmxMorph[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pmx::PmxMorph_*,_std::default_delete<pmx::PmxMorph[]>_>
                                  .super__Head_base<0UL,_pmx::PmxMorph_*,_false>._M_head_impl)->
                                 morph_name + lVar20),stream,(PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x80;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->frame_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar13 = (ulong)this->frame_count;
      auVar7._8_8_ = 0;
      auVar7._0_8_ = uVar13;
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar7 * ZEXT816(0x50),8) == 0) {
        uVar12 = SUB168(auVar7 * ZEXT816(0x50),0) | 8;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      *puVar14 = uVar13;
      if (uVar13 != 0) {
        lVar20 = uVar13 * 0x50;
        puVar17 = puVar14 + 7;
        do {
          puVar17[-6] = (ulong)(puVar17 + -4);
          puVar17[-5] = 0;
          *(undefined1 *)(puVar17 + -4) = 0;
          puVar17[-2] = (ulong)puVar17;
          puVar17[-1] = 0;
          *(undefined1 *)puVar17 = 0;
          *(undefined1 *)(puVar17 + 2) = 0;
          *(undefined4 *)((long)puVar17 + 0x14) = 0;
          puVar17[3] = 0;
          puVar17 = puVar17 + 10;
          lVar20 = lVar20 + -0x50;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxFrame *)0x0;
      __ptr_04 = (this->frames)._M_t.
                 super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
                 super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl;
      (this->frames)._M_t.
      super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>.
      super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl = (PmxFrame *)(puVar14 + 1);
      if (__ptr_04 != (PmxFrame *)0x0) {
        std::default_delete<pmx::PmxFrame[]>::operator()
                  ((default_delete<pmx::PmxFrame[]> *)&this->frames,__ptr_04);
      }
      if ((PmxFrame *)local_68._0_8_ != (PmxFrame *)0x0) {
        std::default_delete<pmx::PmxFrame[]>::operator()
                  ((default_delete<pmx::PmxFrame[]> *)local_68,(PmxFrame *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxFrame::Read((PmxFrame *)
                         ((long)&((this->frames)._M_t.
                                  super___uniq_ptr_impl<pmx::PmxFrame,_std::default_delete<pmx::PmxFrame[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pmx::PmxFrame_*,_std::default_delete<pmx::PmxFrame[]>_>
                                  .super__Head_base<0UL,_pmx::PmxFrame_*,_false>._M_head_impl)->
                                 frame_name + lVar20),stream,(PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x50;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->rigid_body_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar22 = (ulong)this->rigid_body_count;
      auVar8._8_8_ = 0;
      auVar8._0_8_ = uVar22;
      uVar12 = SUB168(auVar8 * ZEXT816(0x88),0);
      uVar13 = uVar12 + 8;
      if (0xfffffffffffffff7 < uVar12) {
        uVar13 = 0xffffffffffffffff;
      }
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar8 * ZEXT816(0x88),8) == 0) {
        uVar12 = uVar13;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      *puVar14 = uVar22;
      if (uVar22 != 0) {
        lVar20 = uVar22 * 0x88;
        puVar17 = puVar14 + 7;
        do {
          puVar17[-6] = (ulong)(puVar17 + -4);
          puVar17[-5] = 0;
          *(undefined1 *)(puVar17 + -4) = 0;
          puVar17[-2] = (ulong)puVar17;
          puVar17[-1] = 0;
          *(undefined1 *)puVar17 = 0;
          *(undefined4 *)(puVar17 + 2) = 0;
          *(undefined1 *)((long)puVar17 + 0x14) = 0;
          *(undefined2 *)((long)puVar17 + 0x16) = 0;
          *(undefined1 *)(puVar17 + 3) = 0;
          *(undefined8 *)((long)puVar17 + 0x1c) = 0;
          *(undefined8 *)((long)puVar17 + 0x24) = 0;
          *(undefined8 *)((long)puVar17 + 0x2c) = 0;
          *(undefined8 *)((long)puVar17 + 0x34) = 0;
          *(undefined8 *)((long)puVar17 + 0x3c) = 0;
          *(undefined8 *)((long)puVar17 + 0x44) = 0;
          *(undefined8 *)((long)puVar17 + 0x45) = 0;
          *(undefined8 *)((long)puVar17 + 0x4d) = 0;
          puVar17 = puVar17 + 0x11;
          lVar20 = lVar20 + -0x88;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxRigidBody *)0x0;
      __ptr_05 = (this->rigid_bodies)._M_t.
                 super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>
                 ._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>
                 .super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl;
      (this->rigid_bodies)._M_t.
      super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>.
      super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl = (PmxRigidBody *)(puVar14 + 1)
      ;
      if (__ptr_05 != (PmxRigidBody *)0x0) {
        std::default_delete<pmx::PmxRigidBody[]>::operator()
                  ((default_delete<pmx::PmxRigidBody[]> *)&this->rigid_bodies,__ptr_05);
      }
      if ((PmxRigidBody *)local_68._0_8_ != (PmxRigidBody *)0x0) {
        std::default_delete<pmx::PmxRigidBody[]>::operator()
                  ((default_delete<pmx::PmxRigidBody[]> *)local_68,(PmxRigidBody *)local_68._0_8_);
      }
      uVar10 = local_48._M_allocated_capacity;
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxRigidBody::Read((PmxRigidBody *)
                             ((long)((this->rigid_bodies)._M_t.
                                     super___uniq_ptr_impl<pmx::PmxRigidBody,_std::default_delete<pmx::PmxRigidBody[]>_>
                                     ._M_t.
                                     super__Tuple_impl<0UL,_pmx::PmxRigidBody_*,_std::default_delete<pmx::PmxRigidBody[]>_>
                                     .super__Head_base<0UL,_pmx::PmxRigidBody_*,_false>._M_head_impl
                                    )->size + lVar20 + 0xffffffffffffffb4U),stream,
                             (PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0x88;
        } while (lVar23 < *piVar3);
      }
      piVar3 = &this->joint_count;
      std::istream::read((char *)stream,(long)piVar3);
      uVar13 = (ulong)this->joint_count;
      auVar9._8_8_ = 0;
      auVar9._0_8_ = uVar13;
      uVar12 = 0xffffffffffffffff;
      if (SUB168(auVar9 * ZEXT816(0xb0),8) == 0) {
        uVar12 = SUB168(auVar9 * ZEXT816(0xb0),0) | 8;
      }
      puVar14 = (ulong *)operator_new__(uVar12);
      local_38 = (PmxJoint *)(puVar14 + 1);
      *puVar14 = uVar13;
      if (uVar13 != 0) {
        lVar20 = uVar13 * 0xb0;
        puVar14 = puVar14 + 7;
        do {
          memset(puVar14 + -6,0,0xb0);
          puVar14[-6] = (ulong)(puVar14 + -4);
          puVar14[-5] = 0;
          *(undefined1 *)(puVar14 + -4) = 0;
          puVar14[-2] = (ulong)puVar14;
          puVar14[-1] = 0;
          *(undefined1 *)puVar14 = 0;
          *(undefined8 *)((long)puVar14 + 0x14) = 0;
          *(undefined8 *)((long)puVar14 + 0x1c) = 0;
          *(undefined8 *)((long)puVar14 + 0x24) = 0;
          *(undefined8 *)((long)puVar14 + 0x2c) = 0;
          *(undefined8 *)((long)puVar14 + 0x34) = 0;
          *(undefined8 *)((long)puVar14 + 0x3c) = 0;
          *(undefined8 *)((long)puVar14 + 0x44) = 0;
          *(undefined8 *)((long)puVar14 + 0x4c) = 0;
          *(undefined8 *)((long)puVar14 + 0x54) = 0;
          *(undefined8 *)((long)puVar14 + 0x5c) = 0;
          *(undefined8 *)((long)puVar14 + 100) = 0;
          *(undefined8 *)((long)puVar14 + 0x6c) = 0;
          *(undefined8 *)((long)puVar14 + 0x74) = 0;
          puVar14 = puVar14 + 0x16;
          lVar20 = lVar20 + -0xb0;
        } while (lVar20 != 0);
      }
      local_68._0_8_ = (PmxJoint *)0x0;
      __ptr_06 = (this->joints)._M_t.
                 super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
                 super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
                 super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl;
      (this->joints)._M_t.
      super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>._M_t.
      super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>.
      super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl = local_38;
      if (__ptr_06 != (PmxJoint *)0x0) {
        std::default_delete<pmx::PmxJoint[]>::operator()
                  ((default_delete<pmx::PmxJoint[]> *)&this->joints,__ptr_06);
      }
      uVar10 = local_48._M_allocated_capacity;
      if ((PmxJoint *)local_68._0_8_ != (PmxJoint *)0x0) {
        std::default_delete<pmx::PmxJoint[]>::operator()
                  ((default_delete<pmx::PmxJoint[]> *)local_68,(PmxJoint *)local_68._0_8_);
      }
      if (0 < *piVar3) {
        lVar20 = 0;
        lVar23 = 0;
        do {
          PmxJoint::Read((PmxJoint *)
                         ((long)&((this->joints)._M_t.
                                  super___uniq_ptr_impl<pmx::PmxJoint,_std::default_delete<pmx::PmxJoint[]>_>
                                  ._M_t.
                                  super__Tuple_impl<0UL,_pmx::PmxJoint_*,_std::default_delete<pmx::PmxJoint[]>_>
                                  .super__Head_base<0UL,_pmx::PmxJoint_*,_false>._M_head_impl)->
                                 param + lVar20 + 0xffffffffffffffbcU),stream,(PmxSetting *)uVar10);
          lVar23 = lVar23 + 1;
          lVar20 = lVar20 + 0xb0;
        } while (lVar23 < *piVar3);
      }
      return;
    }
    poVar18 = std::operator<<((ostream *)&std::cerr,"this is not ver2.0 or ver2.1 but ");
    poVar18 = (ostream *)std::ostream::operator<<(poVar18,this->version);
    pcVar21 = ".";
  }
  else {
    poVar18 = (ostream *)&std::cerr;
    pcVar21 = "invalid magic number.";
  }
  poVar18 = std::operator<<(poVar18,pcVar21);
  std::endl<char,std::char_traits<char>>(poVar18);
  __cxa_rethrow();
}

Assistant:

void PmxModel::Read(std::istream *stream)
	{
		// マジック
		char magic[4];
		stream->read((char*) magic, sizeof(char) * 4);
		if (magic[0] != 0x50 || magic[1] != 0x4d || magic[2] != 0x58 || magic[3] != 0x20)
		{
			std::cerr << "invalid magic number." << std::endl;
			throw;
		}
		// バージョン
		stream->read((char*) &version, sizeof(float));
		if (version != 2.0f && version != 2.1f)
		{
			std::cerr << "this is not ver2.0 or ver2.1 but " << version << "." << std::endl;
			throw;
		}
		// ファイル設定
		this->setting.Read(stream);

		// モデル情報
		this->model_name = std::move(ReadString(stream, setting.encoding));
		this->model_english_name = std::move(ReadString(stream, setting.encoding));
		this->model_comment = std::move(ReadString(stream, setting.encoding));
		this->model_english_comment = std::move(ReadString(stream, setting.encoding));

		// 頂点
		stream->read((char*) &vertex_count, sizeof(int));
		this->vertices = std::make_unique<PmxVertex []>(vertex_count);
		for (int i = 0; i < vertex_count; i++)
		{
			vertices[i].Read(stream, &setting);
		}

		// 面
		stream->read((char*) &index_count, sizeof(int));
		this->indices = std::make_unique<int []>(index_count);
		for (int i = 0; i < index_count; i++)
		{
			this->indices[i] = ReadIndex(stream, setting.vertex_index_size);
		}

		// テクスチャ
		stream->read((char*) &texture_count, sizeof(int));
		this->textures = std::make_unique<utfstring []>(texture_count);
		for (int i = 0; i < texture_count; i++)
		{
			this->textures[i] = ReadString(stream, setting.encoding);
		}

		// マテリアル
		stream->read((char*) &material_count, sizeof(int));
		this->materials = std::make_unique<PmxMaterial []>(material_count);
		for (int i = 0; i < material_count; i++)
		{
			this->materials[i].Read(stream, &setting);
		}

		// ボーン
		stream->read((char*) &this->bone_count, sizeof(int));
		this->bones = std::make_unique<PmxBone []>(this->bone_count);
		for (int i = 0; i < this->bone_count; i++)
		{
			this->bones[i].Read(stream, &setting);
		}

		// モーフ
		stream->read((char*) &this->morph_count, sizeof(int));
		this->morphs = std::make_unique<PmxMorph []>(this->morph_count);
		for (int i = 0; i < this->morph_count; i++)
		{
			this->morphs[i].Read(stream, &setting);
		}

		// 表示枠
		stream->read((char*) &this->frame_count, sizeof(int));
		this->frames = std::make_unique<PmxFrame []>(this->frame_count);
		for (int i = 0; i < this->frame_count; i++)
		{
			this->frames[i].Read(stream, &setting);
		}

		// 剛体
		stream->read((char*) &this->rigid_body_count, sizeof(int));
		this->rigid_bodies = std::make_unique<PmxRigidBody []>(this->rigid_body_count);
		for (int i = 0; i < this->rigid_body_count; i++)
		{
			this->rigid_bodies[i].Read(stream, &setting);
		}

		// ジョイント
		stream->read((char*) &this->joint_count, sizeof(int));
		this->joints = std::make_unique<PmxJoint []>(this->joint_count);
		for (int i = 0; i < this->joint_count; i++)
		{
			this->joints[i].Read(stream, &setting);
		}

		//// ソフトボディ
		//if (this->version == 2.1f)
		//{
		//	stream->read((char*) &this->soft_body_count, sizeof(int));
		//	this->soft_bodies = std::make_unique<PmxSoftBody []>(this->soft_body_count);
		//	for (int i = 0; i < this->soft_body_count; i++)
		//	{
		//		this->soft_bodies[i].Read(stream, &setting);
		//	}
		//}
	}